

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  long *plVar1;
  undefined8 *puVar2;
  Encoding EVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ParseFlags global_flags;
  uint uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Regexp *pRVar14;
  Prog *pPVar15;
  ostream *poVar16;
  string *psVar17;
  RegexpStatusCode RVar18;
  undefined8 *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  bool foldcase;
  RegexpStatus status;
  re2 local_1f8 [32];
  Regexp *suffix;
  size_type local_1d0;
  string local_1c8;
  LogMessage local_1a8;
  
  local_1a8._0_8_ = &status;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_1a8;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar11 = pthread_once(&Init::empty_once._M_once,__once_proxy);
  if (iVar11 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new(0x20);
    StringPiece::operator_cast_to_string(pbVar13,pattern);
    this->pattern_ = pbVar13;
    EVar3 = options->encoding_;
    bVar10 = options->posix_syntax_;
    bVar4 = options->longest_match_;
    bVar5 = options->log_errors_;
    bVar6 = options->literal_;
    (this->options_).max_mem_ = options->max_mem_;
    (this->options_).encoding_ = EVar3;
    (this->options_).posix_syntax_ = bVar10;
    (this->options_).longest_match_ = bVar4;
    (this->options_).log_errors_ = bVar5;
    (this->options_).literal_ = bVar6;
    bVar10 = options->never_nl_;
    bVar4 = options->dot_nl_;
    bVar5 = options->never_capture_;
    bVar6 = options->case_sensitive_;
    bVar7 = options->perl_classes_;
    bVar8 = options->word_boundary_;
    bVar9 = options->one_line_;
    (this->options_).literal_ = options->literal_;
    (this->options_).never_nl_ = bVar10;
    (this->options_).dot_nl_ = bVar4;
    (this->options_).never_capture_ = bVar5;
    (this->options_).case_sensitive_ = bVar6;
    (this->options_).perl_classes_ = bVar7;
    (this->options_).word_boundary_ = bVar8;
    (this->options_).one_line_ = bVar9;
    this->entire_regexp_ = (Regexp *)0x0;
    this->suffix_regexp_ = (Regexp *)0x0;
    this->error_ = (string *)empty_storage;
    this->error_arg_ = (string *)empty_storage;
    this->num_captures_ = -1;
    *(uint *)&this->field_0x44 = (uint)(this->options_).longest_match_ << 0x1d;
    (this->prefix_)._M_string_length = 0;
    *(this->prefix_)._M_dataplus._M_p = '\0';
    this->named_groups_ =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x0;
    this->group_names_ =
         (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    this->prog_ = (Prog *)0x0;
    this->rprog_ = (Prog *)0x0;
    status.code_ = kRegexpSuccess;
    status.error_arg_.data_ = (const_pointer)0x0;
    status.error_arg_.size_ = 0;
    status.tmp_ = (string *)0x0;
    local_1a8._0_8_ = (this->pattern_->_M_dataplus)._M_p;
    local_1a8._8_8_ = this->pattern_->_M_string_length;
    global_flags = Options::ParseFlags(&this->options_);
    pRVar14 = Regexp::Parse((StringPiece *)&local_1a8,global_flags,&status);
    this->entire_regexp_ = pRVar14;
    if (pRVar14 == (Regexp *)0x0) {
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/re2.cc"
                   ,0xe7);
        poVar16 = std::operator<<((ostream *)&local_1a8.str_,"Error parsing \'");
        suffix = (Regexp *)(this->pattern_->_M_dataplus)._M_p;
        local_1d0 = this->pattern_->_M_string_length;
        trunc_abi_cxx11_(local_1f8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar16 = std::operator<<(poVar16,(string *)local_1f8);
        poVar16 = std::operator<<(poVar16,"\': ");
        RegexpStatus::Text_abi_cxx11_(&local_1c8,&status);
        std::operator<<(poVar16,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)local_1f8);
        LogMessage::~LogMessage(&local_1a8);
      }
      psVar17 = (string *)operator_new(0x20);
      RegexpStatus::Text_abi_cxx11_(psVar17,&status);
      this->error_ = psVar17;
      RVar18 = kRegexpInternalError;
      if (status.code_ < (kRegexpBadNamedCapture|kRegexpInternalError)) {
        RVar18 = status.code_;
      }
      *(RegexpStatusCode *)&this->field_0x44 =
           *(RegexpStatusCode *)&this->field_0x44 & 0xe0000000 | RVar18;
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x20);
      StringPiece::operator_cast_to_string(pbVar13,&status.error_arg_);
      this->error_arg_ = pbVar13;
    }
    else {
      bVar10 = Regexp::RequiredPrefix(pRVar14,&this->prefix_,&foldcase,&suffix);
      if (bVar10) {
        *(uint *)&this->field_0x44 =
             *(uint *)&this->field_0x44 & 0x7fffffff | (uint)foldcase << 0x1f;
        pRVar14 = suffix;
      }
      else {
        pRVar14 = Regexp::Incref(this->entire_regexp_);
      }
      this->suffix_regexp_ = pRVar14;
      pPVar15 = Regexp::CompileToProg(pRVar14,((this->options_).max_mem_ * 2) / 3);
      this->prog_ = pPVar15;
      if (pPVar15 == (Prog *)0x0) {
        if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/re2.cc"
                     ,0x100);
          poVar16 = std::operator<<((ostream *)&local_1a8.str_,"Error compiling \'");
          local_1c8._M_dataplus._M_p = (this->pattern_->_M_dataplus)._M_p;
          local_1c8._M_string_length = this->pattern_->_M_string_length;
          trunc_abi_cxx11_(local_1f8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          poVar16 = std::operator<<(poVar16,(string *)local_1f8);
          std::operator<<(poVar16,"\'");
          std::__cxx11::string::~string((string *)local_1f8);
          LogMessage::~LogMessage(&local_1a8);
        }
        psVar17 = (string *)operator_new(0x20);
        std::__cxx11::string::string
                  ((string *)psVar17,"pattern too large - compile failed",(allocator *)&local_1a8);
        this->error_ = psVar17;
        uVar12 = *(uint *)&this->field_0x44 & 0xe0000000 | 0xf;
      }
      else {
        iVar11 = Regexp::NumCaptures(this->suffix_regexp_);
        this->num_captures_ = iVar11;
        bVar10 = Prog::IsOnePass(this->prog_);
        uVar12 = *(uint *)&this->field_0x44 & 0xbfffffff | (uint)bVar10 << 0x1e;
      }
      *(uint *)&this->field_0x44 = uVar12;
    }
    RegexpStatus::~RegexpStatus(&status);
    return;
  }
  std::__throw_system_error(iVar11);
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    (void) new (empty_storage) EmptyStorage;
  });

  pattern_ = new std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  error_ = empty_string();
  error_arg_ = empty_string();

  num_captures_ = -1;
  error_code_ = NoError;
  longest_match_ = options_.longest_match();
  is_one_pass_ = false;
  prefix_foldcase_ = false;
  prefix_.clear();
  prog_ = NULL;

  rprog_ = NULL;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    *pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(*pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = new std::string(status.error_arg());
    return;
  }

  bool foldcase;
  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &foldcase, &suffix)) {
    prefix_foldcase_ = foldcase;
    suffix_regexp_ = suffix;
  }
  else {
    suffix_regexp_ = entire_regexp_->Incref();
  }

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(*pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}